

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

void __thiscall iDynTree::MatrixDynSize::fillColMajorBuffer(MatrixDynSize *this,double *colMajorBuf)

{
  double dVar1;
  double *pdVar2;
  size_t sVar3;
  long in_RSI;
  MatrixDynSize *in_RDI;
  size_t col;
  size_t row;
  ulong local_20;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar3 = rows(in_RDI);
    if (sVar3 <= local_18) break;
    local_20 = 0;
    while( true ) {
      sVar3 = cols(in_RDI);
      if (sVar3 <= local_20) break;
      pdVar2 = in_RDI->m_data;
      sVar3 = rawIndexRowMajor(in_RDI,local_18,local_20);
      dVar1 = pdVar2[sVar3];
      sVar3 = rawIndexColMajor(in_RDI,local_18,local_20);
      *(double *)(in_RSI + sVar3 * 8) = dVar1;
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void MatrixDynSize::fillColMajorBuffer(double* colMajorBuf) const
{
    for(std::size_t row = 0; row < this->rows(); row++ )
    {
        for(std::size_t col = 0; col < this->cols(); col++ )
        {
            colMajorBuf[this->rawIndexColMajor(row,col)] =
                this->m_data[this->rawIndexRowMajor(row,col)];
        }
    }
}